

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ListeningReporter::reportInvalidArguments(ListeningReporter *this,string *arg)

{
  bool bVar1;
  pointer pIVar2;
  undefined8 in_RSI;
  vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
  *in_RDI;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *listener;
  iterator __end1;
  iterator __begin1;
  Reporters *__range1;
  __normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
  local_20;
  pointer *local_18;
  undefined8 local_10;
  
  local_18 = &(in_RDI->
              super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_10 = in_RSI;
  local_20._M_current =
       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *)
       clara::std::
       vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
       ::begin(in_RDI);
  clara::std::
  vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
            ::operator*(&local_20);
    pIVar2 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                           *)0x14c7bc);
    (*pIVar2->_vptr_IStreamingReporter[4])(pIVar2,local_10);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
    ::operator++(&local_20);
  }
  pIVar2 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x14c7e3);
  (*pIVar2->_vptr_IStreamingReporter[4])(pIVar2,local_10);
  return;
}

Assistant:

void ListeningReporter::reportInvalidArguments(std::string const&arg){
        for ( auto const& listener : m_listeners ) {
            listener->reportInvalidArguments( arg );
        }
        m_reporter->reportInvalidArguments( arg );
    }